

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_subscribe_callback
               (pa_context *ctx,pa_subscription_event_type_t t,uint32_t index,void *userdata)

{
  code *UNRECOVERED_JUMPTABLE;
  pa_subscription_event_type_t pVar1;
  undefined8 uVar2;
  char *pcVar3;
  pa_subscription_event_type_t pVar4;
  
  pVar4 = t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK;
  if (PA_SUBSCRIPTION_EVENT_SOURCE < pVar4) {
    if (pVar4 != PA_SUBSCRIPTION_EVENT_SERVER) {
      return;
    }
    if ((t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) != PA_SUBSCRIPTION_EVENT_CHANGE) {
      return;
    }
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
       (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
      (*g_cubeb_log_callback)("%s:%d: Server changed %d\n","cubeb_pulse.c",0x5ec,index);
    }
    (*cubeb_pa_context_get_server_info)
              (*(pa_context **)((long)userdata + 0x18),server_info_callback,userdata);
    return;
  }
  if (g_cubeb_log_level != CUBEB_LOG_DISABLED) {
    pVar1 = t & (PA_SUBSCRIPTION_EVENT_TYPE_MASK|PA_SUBSCRIPTION_EVENT_FACILITY_MASK);
    if (pVar1 == PA_SUBSCRIPTION_EVENT_SOURCE) {
      if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
        pcVar3 = "%s:%d: Adding source index %d\n";
        uVar2 = 0x5f9;
LAB_00107113:
        (*g_cubeb_log_callback)(pcVar3,"cubeb_pulse.c",uVar2);
      }
    }
    else if (pVar1 == PA_SUBSCRIPTION_EVENT_REMOVE) {
      if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
        pcVar3 = "%s:%d: Removing sink index %d\n";
        uVar2 = 0x5fd;
        goto LAB_00107113;
      }
    }
    else if (pVar1 == (PA_SUBSCRIPTION_EVENT_REMOVE|PA_SUBSCRIPTION_EVENT_SOURCE)) {
      if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
        pcVar3 = "%s:%d: Removing source index %d\n";
        uVar2 = 0x5f6;
        goto LAB_00107113;
      }
    }
    else if ((t & (PA_SUBSCRIPTION_EVENT_TYPE_MASK|PA_SUBSCRIPTION_EVENT_FACILITY_MASK)) ==
             PA_SUBSCRIPTION_EVENT_NEW) {
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
         (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
        (*g_cubeb_log_callback)("%s:%d: Adding sink index %d\n","cubeb_pulse.c",0x600);
      }
      goto LAB_00107129;
    }
  }
  if ((t & PA_SUBSCRIPTION_EVENT_CHANGE) != PA_SUBSCRIPTION_EVENT_NEW) {
    return;
  }
LAB_00107129:
  if (pVar4 == PA_SUBSCRIPTION_EVENT_SOURCE) {
    UNRECOVERED_JUMPTABLE = *(code **)((long)userdata + 0x48);
    uVar2 = *(undefined8 *)((long)userdata + 0x50);
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)((long)userdata + 0x38);
    uVar2 = *(undefined8 *)((long)userdata + 0x40);
  }
  (*UNRECOVERED_JUMPTABLE)(userdata,uVar2);
  return;
}

Assistant:

static void
pulse_subscribe_callback(pa_context * ctx,
                         pa_subscription_event_type_t t,
                         uint32_t index, void * userdata)
{
  (void)ctx;
  cubeb * context = userdata;

  switch (t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) {
  case PA_SUBSCRIPTION_EVENT_SERVER:
    if ((t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_CHANGE) {
      LOG("Server changed %d", index);
      WRAP(pa_context_get_server_info)(context->context, server_info_callback, context);
    }
    break;
  case PA_SUBSCRIPTION_EVENT_SOURCE:
  case PA_SUBSCRIPTION_EVENT_SINK:

    if (g_cubeb_log_level) {
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SOURCE &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_REMOVE) {
        LOG("Removing source index %d", index);
      } else if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SOURCE &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_NEW) {
        LOG("Adding source index %d", index);
      }
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SINK &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_REMOVE) {
        LOG("Removing sink index %d", index);
      } else if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SINK &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_NEW) {
        LOG("Adding sink index %d", index);
      }
    }

    if ((t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_REMOVE ||
        (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_NEW) {
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SOURCE) {
        context->input_collection_changed_callback(context, context->input_collection_changed_user_ptr);
      }
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) == PA_SUBSCRIPTION_EVENT_SINK) {
        context->output_collection_changed_callback(context, context->output_collection_changed_user_ptr);
      }
    }
    break;
  }
}